

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLKICKING_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000478;
  double *in_stack_00000480;
  double *in_stack_00000488;
  double *in_stack_00000490;
  int in_stack_0000049c;
  int in_stack_000004a0;
  int *in_stack_000004b0;
  int *in_stack_000004b8;
  int *in_stack_000004c0;
  
  TVar1 = TA_CDLKICKING(in_stack_000004a0,in_stack_0000049c,in_stack_00000490,in_stack_00000488,
                        in_stack_00000480,in_stack_00000478,in_stack_000004b0,in_stack_000004b8,
                        in_stack_000004c0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLKICKING_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLKICKING(
/* Generated */                    startIdx,
/* Generated */                    endIdx,
/* Generated */                    params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                    params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                    params->in[0].data.inPrice.low, /* inLow */
/* Generated */                    params->in[0].data.inPrice.close, /* inClose */
/* Generated */                    outBegIdx, 
/* Generated */                    outNBElement, 
/* Generated */                    params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }